

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::Switch::Switch(Switch *this,State st,QWidget *parent)

{
  SwitchPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00194220;
  *(undefined ***)&this->field_0x10 = &PTR__Switch_001943d0;
  this_00 = (SwitchPrivate *)operator_new(0x70);
  SwitchPrivate::SwitchPrivate(this_00,this);
  (this->d).d = this_00;
  QWidget::setSizePolicy((QSizePolicy)SUB84(this,0));
  SwitchPrivate::setState((this->d).d,st);
  return;
}

Assistant:

Switch::Switch( State st, QWidget * parent )
	:	QWidget( parent )
	,	d( new SwitchPrivate( this ) )
{
	setSizePolicy( QSizePolicy( QSizePolicy::Fixed, QSizePolicy::Fixed ) );

	setState( st );
}